

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::roundSignificandWithExponent
          (IEEEFloat *this,integerPart *decSigParts,uint sigPartCount,int exp,
          roundingMode rounding_mode)

{
  opStatus oVar1;
  opStatus oVar2;
  int iVar3;
  uint uVar4;
  lostFraction lost_fraction;
  integerPart *piVar5;
  integerPart iVar6;
  integerPart *src;
  bool bVar7;
  uint local_138c;
  bool local_1371;
  uint local_136c;
  uint powHUerr;
  integerPart HUdistance;
  integerPart HUerr;
  undefined1 local_1350 [4];
  lostFraction calcLostFraction;
  IEEEFloat pow5;
  IEEEFloat decSig;
  uint local_1318;
  uint truncatedBits;
  uint excessPrecision;
  opStatus powStatus;
  opStatus sigStatus;
  bool isNearest;
  integerPart pow5Parts [600];
  undefined1 local_40 [8];
  fltSemantics calcSemantics;
  uint pow5PartCount;
  uint parts;
  roundingMode rounding_mode_local;
  int exp_local;
  uint sigPartCount_local;
  integerPart *decSigParts_local;
  IEEEFloat *this_local;
  
  local_40._0_2_ = 0x7fff;
  local_40._2_2_ = -0x7fff;
  local_40._4_4_ = 0;
  calcSemantics.maxExponent = 0;
  calcSemantics.minExponent = 0;
  local_1371 = rounding_mode == rmNearestTiesToEven || rounding_mode == rmNearestTiesToAway;
  calcSemantics.sizeInBits = partCountForBits(this->semantics->precision + 0xb);
  local_138c = exp;
  if (exp < 0) {
    local_138c = -exp;
  }
  calcSemantics.precision = powerOf5((integerPart *)&sigStatus,local_138c);
  while( true ) {
    local_40._4_4_ = calcSemantics.sizeInBits * 0x40 - 1;
    decSig._20_4_ = local_40._4_4_ - this->semantics->precision;
    IEEEFloat((IEEEFloat *)&pow5.exponent,(fltSemantics *)local_40,uninitialized);
    makeZero((IEEEFloat *)&pow5.exponent,((byte)this->field_0x12 >> 3 & 1) != 0);
    IEEEFloat((IEEEFloat *)local_1350,(fltSemantics *)local_40);
    oVar1 = convertFromUnsignedParts
                      ((IEEEFloat *)&pow5.exponent,decSigParts,sigPartCount,rmNearestTiesToEven);
    oVar2 = convertFromUnsignedParts
                      ((IEEEFloat *)local_1350,(integerPart *)&sigStatus,calcSemantics.precision,
                       rmNearestTiesToEven);
    decSig.significand.part._0_2_ = decSig.significand.part._0_2_ + (short)exp;
    local_1318 = decSig._20_4_;
    if (exp < 0) {
      HUerr._4_4_ = divideSignificand((IEEEFloat *)&pow5.exponent,(IEEEFloat *)local_1350);
      if (((short)decSig.significand.part._0_2_ < this->semantics->minExponent) &&
         (decSig._20_4_ =
               ((int)this->semantics->minExponent - (int)(short)decSig.significand.part._0_2_) +
               decSig._20_4_, local_1318 = decSig._20_4_, (uint)local_40._4_4_ < (uint)decSig._20_4_
         )) {
        local_1318 = local_40._4_4_;
      }
      local_136c = 2;
      if (oVar2 == opOK && HUerr._4_4_ == lfExactlyZero) {
        local_136c = 0;
      }
    }
    else {
      HUerr._4_4_ = multiplySignificand((IEEEFloat *)&pow5.exponent,(IEEEFloat *)local_1350,
                                        (IEEEFloat *)0x0);
      local_136c = (uint)(oVar2 != opOK);
    }
    piVar5 = significandParts((IEEEFloat *)&pow5.exponent);
    iVar3 = APInt::tcExtractBit(piVar5,local_40._4_4_ - 1);
    if (iVar3 != 1) break;
    uVar4 = HUerrBound(HUerr._4_4_ != lfExactlyZero,(uint)(oVar1 != opOK),local_136c);
    piVar5 = significandParts((IEEEFloat *)&pow5.exponent);
    iVar6 = ulpsFromBoundary(piVar5,local_1318,local_1371);
    bVar7 = (ulong)uVar4 <= iVar6 << 1;
    if (bVar7) {
      piVar5 = significandParts(this);
      uVar4 = partCount(this);
      src = significandParts((IEEEFloat *)&pow5.exponent);
      APInt::tcExtract(piVar5,uVar4,src,local_40._4_4_ - local_1318,local_1318);
      this->exponent =
           (decSig.significand.part._0_2_ + (short)this->semantics->precision) -
           ((short)local_40._4_4_ - (short)local_1318);
      piVar5 = significandParts((IEEEFloat *)&pow5.exponent);
      uVar4 = partCount((IEEEFloat *)&pow5.exponent);
      lost_fraction = lostFractionThroughTruncation(piVar5,uVar4,decSig._20_4_);
      this_local._4_4_ = normalize(this,rounding_mode,lost_fraction);
    }
    ~IEEEFloat((IEEEFloat *)local_1350);
    ~IEEEFloat((IEEEFloat *)&pow5.exponent);
    if (bVar7) {
      return this_local._4_4_;
    }
    calcSemantics.sizeInBits = calcSemantics.sizeInBits << 1;
  }
  __assert_fail("APInt::tcExtractBit (decSig.significandParts(), calcSemantics.precision - 1) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x969,
                "IEEEFloat::opStatus llvm::detail::IEEEFloat::roundSignificandWithExponent(const integerPart *, unsigned int, int, roundingMode)"
               );
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::roundSignificandWithExponent(const integerPart *decSigParts,
                                        unsigned sigPartCount, int exp,
                                        roundingMode rounding_mode) {
  unsigned int parts, pow5PartCount;
  fltSemantics calcSemantics = { 32767, -32767, 0, 0 };
  integerPart pow5Parts[maxPowerOfFiveParts];
  bool isNearest;

  isNearest = (rounding_mode == rmNearestTiesToEven ||
               rounding_mode == rmNearestTiesToAway);

  parts = partCountForBits(semantics->precision + 11);

  /* Calculate pow(5, abs(exp)).  */
  pow5PartCount = powerOf5(pow5Parts, exp >= 0 ? exp: -exp);

  for (;; parts *= 2) {
    opStatus sigStatus, powStatus;
    unsigned int excessPrecision, truncatedBits;

    calcSemantics.precision = parts * integerPartWidth - 1;
    excessPrecision = calcSemantics.precision - semantics->precision;
    truncatedBits = excessPrecision;

    IEEEFloat decSig(calcSemantics, uninitialized);
    decSig.makeZero(sign);
    IEEEFloat pow5(calcSemantics);

    sigStatus = decSig.convertFromUnsignedParts(decSigParts, sigPartCount,
                                                rmNearestTiesToEven);
    powStatus = pow5.convertFromUnsignedParts(pow5Parts, pow5PartCount,
                                              rmNearestTiesToEven);
    /* Add exp, as 10^n = 5^n * 2^n.  */
    decSig.exponent += exp;

    lostFraction calcLostFraction;
    integerPart HUerr, HUdistance;
    unsigned int powHUerr;

    if (exp >= 0) {
      /* multiplySignificand leaves the precision-th bit set to 1.  */
      calcLostFraction = decSig.multiplySignificand(pow5, nullptr);
      powHUerr = powStatus != opOK;
    } else {
      calcLostFraction = decSig.divideSignificand(pow5);
      /* Denormal numbers have less precision.  */
      if (decSig.exponent < semantics->minExponent) {
        excessPrecision += (semantics->minExponent - decSig.exponent);
        truncatedBits = excessPrecision;
        if (excessPrecision > calcSemantics.precision)
          excessPrecision = calcSemantics.precision;
      }
      /* Extra half-ulp lost in reciprocal of exponent.  */
      powHUerr = (powStatus == opOK && calcLostFraction == lfExactlyZero) ? 0:2;
    }

    /* Both multiplySignificand and divideSignificand return the
       result with the integer bit set.  */
    assert(APInt::tcExtractBit
           (decSig.significandParts(), calcSemantics.precision - 1) == 1);

    HUerr = HUerrBound(calcLostFraction != lfExactlyZero, sigStatus != opOK,
                       powHUerr);
    HUdistance = 2 * ulpsFromBoundary(decSig.significandParts(),
                                      excessPrecision, isNearest);

    /* Are we guaranteed to round correctly if we truncate?  */
    if (HUdistance >= HUerr) {
      APInt::tcExtract(significandParts(), partCount(), decSig.significandParts(),
                       calcSemantics.precision - excessPrecision,
                       excessPrecision);
      /* Take the exponent of decSig.  If we tcExtract-ed less bits
         above we must adjust our exponent to compensate for the
         implicit right shift.  */
      exponent = (decSig.exponent + semantics->precision
                  - (calcSemantics.precision - excessPrecision));
      calcLostFraction = lostFractionThroughTruncation(decSig.significandParts(),
                                                       decSig.partCount(),
                                                       truncatedBits);
      return normalize(rounding_mode, calcLostFraction);
    }
  }
}